

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption
          (UninterpretedOption *this,UninterpretedOption *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  int64 iVar2;
  uint uVar3;
  Arena *pAVar4;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__UninterpretedOption_003e0ec8;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::RepeatedPtrField
            (&this->name_,&from->name_);
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  (this->identifier_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar3 = (from->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    pAVar4 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->identifier_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->identifier_value_).ptr_,pAVar4);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  (this->string_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar3 & 2) != 0) {
    pAVar4 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->string_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->string_value_).ptr_,pAVar4);
    uVar3 = (from->_has_bits_).has_bits_[0];
  }
  (this->aggregate_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar3 & 4) != 0) {
    pAVar4 = (Arena *)this_00->ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set
              (&this->aggregate_value_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->aggregate_value_).ptr_,pAVar4);
  }
  this->double_value_ = from->double_value_;
  iVar2 = from->negative_int_value_;
  this->positive_int_value_ = from->positive_int_value_;
  this->negative_int_value_ = iVar2;
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption(const UninterpretedOption& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _has_bits_(from._has_bits_),
      name_(from.name_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  identifier_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_identifier_value()) {
    identifier_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_identifier_value(),
      GetArena());
  }
  string_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_string_value()) {
    string_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_string_value(),
      GetArena());
  }
  aggregate_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_aggregate_value()) {
    aggregate_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_aggregate_value(),
      GetArena());
  }
  ::memcpy(&positive_int_value_, &from.positive_int_value_,
    static_cast<size_t>(reinterpret_cast<char*>(&double_value_) -
    reinterpret_cast<char*>(&positive_int_value_)) + sizeof(double_value_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.UninterpretedOption)
}